

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O3

bool __thiscall
cmStringReplaceHelper::Replace(cmStringReplaceHelper *this,string *input,string *output)

{
  RegularExpression *this_00;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pRVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pRVar11;
  char *pcVar12;
  ostringstream error;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  this_00 = &this->RegularExpression;
  bVar5 = cmsys::RegularExpression::find(this_00,(input->_M_dataplus)._M_p,&this_00->regmatch);
  pcVar12 = (char *)0x0;
  if (bVar5) {
    do {
      if (this->Makefile != (cmMakefile *)0x0) {
        cmMakefile::ClearMatches(this->Makefile);
        cmMakefile::StoreMatches(this->Makefile,this_00);
      }
      pcVar1 = (this->RegularExpression).regmatch.startp[0];
      pcVar2 = (this->RegularExpression).regmatch.endp[0];
      pcVar3 = (this->RegularExpression).regmatch.searchstring;
      std::__cxx11::string::substr((ulong)local_1a8,(ulong)input);
      std::__cxx11::string::_M_append((char *)output,local_1a8._0_8_);
      if ((_func_int **)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
      }
      if (pcVar2 == pcVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"regex \"",7);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->RegExString)._M_dataplus._M_p,
                            (this->RegExString)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" matched an empty string",0x19)
        ;
        std::__cxx11::stringbuf::str();
LAB_0034b84a:
        std::__cxx11::string::operator=((string *)this,(string *)local_1c8);
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
      pRVar4 = (this->Replacements).
               super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pRVar11 = (this->Replacements).
                     super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
                     ._M_impl.super__Vector_impl_data._M_start; pRVar11 != pRVar4;
          pRVar11 = pRVar11 + 1) {
        lVar6 = (long)pRVar11->Number;
        if (lVar6 < 0) {
          std::__cxx11::string::_M_append((char *)output,(ulong)(pRVar11->Value)._M_dataplus._M_p);
        }
        else {
          pcVar1 = (this->RegularExpression).regmatch.searchstring;
          uVar10 = (long)(this->RegularExpression).regmatch.startp[lVar6] - (long)pcVar1;
          if ((((uVar10 == 0xffffffffffffffff) ||
               (uVar9 = (long)(this->RegularExpression).regmatch.endp[lVar6] - (long)pcVar1,
               uVar9 == 0xffffffffffffffff)) ||
              (uVar7 = input->_M_string_length - (long)pcVar12, uVar7 < uVar10)) || (uVar7 < uVar9))
          {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"replace expression \"",0x14);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(this->ReplaceExpression)._M_dataplus._M_p,
                                (this->ReplaceExpression)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" contains an out-of-range escape for regex \"",0x2d);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(this->RegExString)._M_dataplus._M_p,
                                (this->RegExString)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
            std::__cxx11::stringbuf::str();
            goto LAB_0034b84a;
          }
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)input);
          std::__cxx11::string::_M_append((char *)output,local_1a8._0_8_);
          if ((_func_int **)local_1a8._0_8_ != local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
          }
        }
      }
      pcVar12 = pcVar2 + ((long)pcVar12 - (long)pcVar3);
      bVar5 = cmsys::RegularExpression::find
                        (this_00,pcVar12 + (long)(input->_M_dataplus)._M_p,&this_00->regmatch);
    } while (bVar5);
  }
  std::__cxx11::string::substr((ulong)local_1a8,(ulong)input);
  std::__cxx11::string::_M_append((char *)output,local_1a8._0_8_);
  if ((_func_int **)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
  }
  return true;
}

Assistant:

bool cmStringReplaceHelper::Replace(const std::string& input,
                                    std::string& output)
{
  output.clear();

  // Scan through the input for all matches.
  std::string::size_type base = 0;
  while (this->RegularExpression.find(input.c_str() + base)) {
    if (this->Makefile != nullptr) {
      this->Makefile->ClearMatches();
      this->Makefile->StoreMatches(this->RegularExpression);
    }
    auto l2 = this->RegularExpression.start();
    auto r = this->RegularExpression.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if (r - l2 == 0) {
      std::ostringstream error;
      error << "regex \"" << this->RegExString << "\" matched an empty string";
      this->ErrorString = error.str();
      return false;
    }

    // Concatenate the replacement for the match.
    for (const auto& replacement : this->Replacements) {
      if (replacement.Number < 0) {
        // This is just a plain-text part of the replacement.
        output += replacement.Value;
      } else {
        // Replace with part of the match.
        auto n = replacement.Number;
        auto start = this->RegularExpression.start(n);
        auto end = this->RegularExpression.end(n);
        auto len = input.length() - base;
        if ((start != std::string::npos) && (end != std::string::npos) &&
            (start <= len) && (end <= len)) {
          output += input.substr(base + start, end - start);
        } else {
          std::ostringstream error;
          error << "replace expression \"" << this->ReplaceExpression
                << "\" contains an out-of-range escape for regex \""
                << this->RegExString << "\"";
          this->ErrorString = error.str();
          return false;
        }
      }
    }

    // Move past the match.
    base += r;
  }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length() - base);

  return true;
}